

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariadicTable.h
# Opt level: O0

void __thiscall
VariadicTable<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
::
print_each<4ul,std::tuple<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>&,std::ostream,void>
          (VariadicTable<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
           *this,basic_ostream<char,_std::char_traits<char>_> *t,
          __tuple_element_t<4UL,_tuple<int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
          *stream)

{
  uint uVar1;
  __tuple_element_t<4UL,_tuple<int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *p_Var2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  ostream *poVar7;
  reference pvVar8;
  left_type p_Var9;
  allocator<char> local_91;
  string local_90 [32];
  int local_70;
  allocator<char> local_59;
  string local_58 [32];
  int local_38;
  int local_34;
  __tuple_element_t<4UL,_tuple<int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *local_30;
  __tuple_element_t<4UL,_tuple<int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *val;
  basic_ostream<char,_std::char_traits<char>_> *stream_local;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *t_local;
  VariadicTable<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  val = stream;
  stream_local = t;
  t_local = (tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this;
  local_30 = std::
             get<4ul,int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                       ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)t);
  bVar3 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)(this + 0x70));
  if (!bVar3) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(this + 0x70));
    p_Var2 = val;
    if (sVar4 != 7) {
      __assert_fail("_precision.size() == std::tuple_size<typename std::remove_reference<TupleType>::type>::value"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lablnet[P]CS2124_filesystem/./src/Disk/../HashTable/../vendor/VariadicTable/VariadicTable.h"
                    ,0xd6,
                    "void VariadicTable<int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>>::print_each(TupleType &&, StreamType &, std::integral_constant<size_t, I>) [Ts = <int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>>, I = 4UL, TupleType = std::tuple<int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>> &, StreamType = std::basic_ostream<char>]"
                   );
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(this + 0x70),4);
    local_34 = (int)std::setprecision(*pvVar5);
    std::operator<<((ostream *)p_Var2,(_Setprecision)local_34);
  }
  bVar3 = std::vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>::empty
                    ((vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>
                      *)(this + 0x58));
  if (!bVar3) {
    sVar4 = std::vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>::size
                      ((vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>
                        *)(this + 0x58));
    if (sVar4 != 7) {
      __assert_fail("_column_format.size() == std::tuple_size<typename std::remove_reference<TupleType>::type>::value"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lablnet[P]CS2124_filesystem/./src/Disk/../HashTable/../vendor/VariadicTable/VariadicTable.h"
                    ,0xdf,
                    "void VariadicTable<int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>>::print_each(TupleType &&, StreamType &, std::integral_constant<size_t, I>) [Ts = <int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>>, I = 4UL, TupleType = std::tuple<int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>> &, StreamType = std::basic_ostream<char>]"
                   );
    }
    pvVar6 = std::vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>::
             operator[]((vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>
                         *)(this + 0x58),4);
    if (*pvVar6 == SCIENTIFIC) {
      std::ostream::operator<<((ostream *)val,std::scientific);
    }
    pvVar6 = std::vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>::
             operator[]((vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>
                         *)(this + 0x58),4);
    if (*pvVar6 == FIXED) {
      std::ostream::operator<<((ostream *)val,std::fixed);
    }
    pvVar6 = std::vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>::
             operator[]((vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>
                         *)(this + 0x58),4);
    if (*pvVar6 == PERCENT) {
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)val,std::fixed);
      local_38 = (int)std::setprecision(2);
      std::operator<<(poVar7,(_Setprecision)local_38);
    }
  }
  p_Var2 = val;
  uVar1 = *(uint *)(this + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,(ulong)uVar1,' ',&local_59);
  poVar7 = std::operator<<((ostream *)p_Var2,local_58);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(this + 0x40),4);
  local_70 = (int)std::setw(*pvVar8);
  poVar7 = std::operator<<(poVar7,(_Setw)local_70);
  p_Var9 = __VariadicTable<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>__justify<std::__cxx11::string&>_long__
                     (0);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(_func_ios_base_ptr_ios_base_ptr *)p_Var9);
  poVar7 = std::operator<<(poVar7,(string *)local_30);
  uVar1 = *(uint *)(this + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,(ulong)uVar1,' ',&local_91);
  poVar7 = std::operator<<(poVar7,local_90);
  std::operator<<(poVar7,"|");
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar3 = std::vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>::empty
                    ((vector<VariadicTableColumnFormat,_std::allocator<VariadicTableColumnFormat>_>
                      *)(this + 0x58));
  if (!bVar3) {
    std::ios_base::unsetf
              ((ios_base *)
               ((long)&(val->_M_dataplus)._M_p + *(long *)((val->_M_dataplus)._M_p + -0x18)),
               _S_floatfield);
  }
  print_each<5ul,std::tuple<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>&,std::ostream,void>
            (this,stream_local,val);
  return;
}

Assistant:

void print_each(TupleType && t, StreamType & stream, std::integral_constant<size_t, I>)
    {
        auto & val = std::get<I>(t);

        // Set the precision
        if (!_precision.empty())
        {
            assert(_precision.size() ==
                   std::tuple_size<typename std::remove_reference<TupleType>::type>::value);

            stream << std::setprecision(_precision[I]);
        }

        // Set the format
        if (!_column_format.empty())
        {
            assert(_column_format.size() ==
                   std::tuple_size<typename std::remove_reference<TupleType>::type>::value);

            if (_column_format[I] == VariadicTableColumnFormat::SCIENTIFIC)
                stream << std::scientific;

            if (_column_format[I] == VariadicTableColumnFormat::FIXED)
                stream << std::fixed;

            if (_column_format[I] == VariadicTableColumnFormat::PERCENT)
                stream << std::fixed << std::setprecision(2);
        }

        stream << std::string(_cell_padding, ' ') << std::setw(_column_sizes[I])
               << justify<decltype(val)>(0) << val << std::string(_cell_padding, ' ') << "|";

        // Unset the format
        if (!_column_format.empty())
        {
            // Because "stream << std::defaultfloat;" won't compile with old GCC or Clang
            stream.unsetf(std::ios_base::floatfield);
        }

        // Recursive call to print the next item
        print_each(std::forward<TupleType>(t), stream, std::integral_constant<size_t, I + 1>());
    }